

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O1

FloatDotsTexture *
pbrt::FloatDotsTexture::Create
          (Transform *renderFromTexture,TextureParameterDictionary *parameters,FileLoc *loc,
          Allocator alloc)

{
  _Base_ptr *pp_Var1;
  _Base_ptr *alloc_00;
  int iVar2;
  undefined4 extraout_var;
  TextureMapping2DHandle map;
  undefined1 local_78 [16];
  TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
  local_68;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTextureHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTextureHandle>_>_>
  *local_60 [2];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTextureHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTextureHandle>_>_>
  local_50;
  FloatDotsTexture *pFVar3;
  
  TextureMapping2DHandle::Create
            ((TextureMapping2DHandle *)&local_68,parameters->dict,renderFromTexture,loc,alloc);
  pp_Var1 = &local_50._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
  alloc_00 = &local_50._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  local_50._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)alloc_00,"inside","");
  TextureParameterDictionary::GetFloatTexture
            ((TextureParameterDictionary *)(local_78 + 8),(string *)parameters,1.0,
             (Allocator)alloc_00);
  local_60[0] = &local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"outside","");
  TextureParameterDictionary::GetFloatTexture
            ((TextureParameterDictionary *)local_78,(string *)parameters,0.0,
             (memory_resource *)local_60);
  iVar2 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x18,8);
  pFVar3 = (FloatDotsTexture *)CONCAT44(extraout_var,iVar2);
  (pFVar3->mapping).
  super_TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
  .bits = local_68.bits;
  (pFVar3->outsideDot).
  super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
  .bits = local_78._8_8_;
  (pFVar3->insideDot).
  super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
  .bits = local_78._0_8_;
  if (local_60[0] != &local_50) {
    operator_delete(local_60[0],local_50._M_t._M_impl._0_8_ + 1);
  }
  if (local_50._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)pp_Var1) {
    operator_delete(local_50._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
                    (ulong)((long)&(local_50._M_t._M_impl.super__Rb_tree_header._M_header._M_right)
                                   ->_M_color + 1));
  }
  return pFVar3;
}

Assistant:

FloatDotsTexture *FloatDotsTexture::Create(const Transform &renderFromTexture,
                                           const TextureParameterDictionary &parameters,
                                           const FileLoc *loc, Allocator alloc) {
    // Initialize 2D texture mapping _map_ from _tp_
    TextureMapping2DHandle map =
        TextureMapping2DHandle::Create(parameters, renderFromTexture, loc, alloc);

    return alloc.new_object<FloatDotsTexture>(
        map, parameters.GetFloatTexture("inside", 1.f, alloc),
        parameters.GetFloatTexture("outside", 0.f, alloc));
}